

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O2

void __thiscall QSyntaxHighlighterPrivate::applyFormatChanges(QSyntaxHighlighterPrivate *this)

{
  QTextBlock *this_00;
  QTextFormat *rhs;
  Data *pDVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QTextLayout *this_01;
  long lVar6;
  iterator aend;
  iterator iVar7;
  long lVar8;
  long lVar9;
  QObject *this_02;
  const_iterator abegin;
  FormatRange *pFVar10;
  FormatRange *pFVar11;
  int iVar12;
  long lVar13;
  long in_FS_OFFSET;
  QArrayDataPointer<QTextLayout::FormatRange> local_78;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->currentBlock;
  this_01 = QTextBlock::layout(this_00);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
  QTextLayout::formats((QList<QTextLayout::FormatRange> *)&local_78,this_01);
  iVar4 = QTextLayout::preeditAreaPosition(this_01);
  QTextLayout::preeditAreaText((QString *)local_58,this_01);
  iVar5 = (int)local_48;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  if (iVar5 == 0) {
    if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
      QList<QTextLayout::FormatRange>::clear((QList<QTextLayout::FormatRange> *)&local_78);
      bVar3 = true;
      goto LAB_0044875e;
    }
  }
  else {
    lVar6 = local_78.size * 0x18;
    iVar12 = iVar5 + iVar4;
    pFVar10 = local_78.ptr;
    for (lVar8 = local_78.size >> 2; pFVar11 = pFVar10, 0 < lVar8; lVar8 = lVar8 + -1) {
      if ((pFVar10->start < iVar4) || (iVar12 < pFVar10->start + pFVar10->length))
      goto LAB_004486cd;
      if ((pFVar10[1].start < iVar4) || (iVar12 < pFVar10[1].start + pFVar10[1].length)) {
        pFVar11 = pFVar10 + 1;
        goto LAB_004486cd;
      }
      if ((pFVar10[2].start < iVar4) || (iVar12 < pFVar10[2].start + pFVar10[2].length)) {
        pFVar11 = pFVar10 + 2;
        goto LAB_004486cd;
      }
      if ((pFVar10[3].start < iVar4) || (iVar12 < pFVar10[3].start + pFVar10[3].length)) {
        pFVar11 = pFVar10 + 3;
        goto LAB_004486cd;
      }
      pFVar10 = pFVar10 + 4;
      lVar6 = lVar6 + -0x60;
    }
    lVar6 = lVar6 / 0x18;
    if (lVar6 == 1) {
LAB_00448952:
      pFVar11 = pFVar10;
      if ((iVar4 <= pFVar10->start) &&
         (pFVar11 = local_78.ptr + local_78.size, iVar12 < pFVar10->start + pFVar10->length)) {
        pFVar11 = pFVar10;
      }
    }
    else if (lVar6 == 2) {
LAB_00448936:
      pFVar11 = pFVar10;
      if ((iVar4 <= pFVar10->start) && (pFVar10->start + pFVar10->length <= iVar12)) {
        pFVar10 = pFVar10 + 1;
        goto LAB_00448952;
      }
    }
    else {
      pFVar11 = local_78.ptr + local_78.size;
      if (((lVar6 == 3) && (pFVar11 = pFVar10, iVar4 <= pFVar10->start)) &&
         (pFVar10->start + pFVar10->length <= iVar12)) {
        pFVar10 = pFVar10 + 1;
        goto LAB_00448936;
      }
    }
LAB_004486cd:
    lVar6 = (long)pFVar11 - (long)local_78.ptr;
    if ((undefined1 *)(lVar6 / 0x18) != (undefined1 *)local_78.size) {
      aend = QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_78);
      iVar7 = QList<QTextLayout::FormatRange>::begin((QList<QTextLayout::FormatRange> *)&local_78);
      abegin.i = iVar7.i + lVar6;
      pFVar10 = abegin.i;
      while (pFVar11 = pFVar10, pFVar10 = pFVar11 + 1, pFVar10 != aend.i) {
        if ((iVar4 <= pFVar10->start) && (pFVar10->start + pFVar11[1].length <= iVar12)) {
          QTextLayout::FormatRange::operator=(abegin.i,pFVar10);
          abegin.i = abegin.i + 1;
        }
      }
      QList<QTextLayout::FormatRange>::erase
                ((QList<QTextLayout::FormatRange> *)&local_78,abegin,(const_iterator)aend.i);
      bVar3 = aend.i != abegin.i && -1 < (long)aend.i - (long)abegin.i;
      goto LAB_0044875e;
    }
  }
  bVar3 = false;
LAB_0044875e:
  rhs = (QTextFormat *)(local_58 + 8);
  lVar6 = 0;
  do {
    lVar8 = (long)(int)lVar6;
    if ((this->formatChanges).d.size <= lVar8) break;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)rhs);
    lVar13 = lVar8 << 4;
    for (; lVar9 = (this->formatChanges).d.size, lVar8 < lVar9; lVar8 = lVar8 + 1) {
      bVar2 = QTextFormat::operator==
                        ((QTextFormat *)
                         ((long)&(((this->formatChanges).d.ptr)->super_QTextFormat).d.d.ptr + lVar13
                         ),rhs);
      if (!bVar2) {
        lVar9 = (this->formatChanges).d.size;
        break;
      }
      lVar13 = lVar13 + 0x10;
    }
    lVar6 = lVar8;
    if (lVar9 != lVar8) {
      local_58._0_4_ = (int)lVar8;
      QTextFormat::operator=
                (rhs,(QTextFormat *)
                     ((long)&(((this->formatChanges).d.ptr)->super_QTextFormat).d.d.ptr + lVar13));
      while ((lVar6 < (this->formatChanges).d.size &&
             (bVar3 = QTextFormat::operator==
                                ((QTextFormat *)
                                 ((long)&(((this->formatChanges).d.ptr)->super_QTextFormat).d.d.ptr
                                 + lVar13),rhs), bVar3))) {
        lVar6 = lVar6 + 1;
        lVar13 = lVar13 + 0x10;
      }
      iVar12 = (int)lVar6;
      local_58._4_4_ = iVar12 - local_58._0_4_;
      if (iVar5 != 0) {
        if ((int)local_58._0_4_ < iVar4) {
          if (iVar4 <= iVar12) {
            local_58._4_4_ = (iVar5 - local_58._0_4_) + iVar12;
          }
        }
        else {
          local_58._0_4_ = local_58._0_4_ + iVar5;
        }
      }
      QList<QTextLayout::FormatRange>::emplaceBack<QTextLayout::FormatRange_const&>
                ((QList<QTextLayout::FormatRange> *)&local_78,(FormatRange *)local_58);
      bVar3 = true;
    }
    QTextFormat::~QTextFormat(rhs);
  } while (lVar9 != lVar8);
  if (bVar3) {
    QTextLayout::setFormats(this_01,(QList<QTextLayout::FormatRange> *)&local_78);
    pDVar1 = (this->doc).wp.d;
    if (pDVar1 == (Data *)0x0) {
      this_02 = (QObject *)0x0;
    }
    else if ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0) {
      this_02 = (QObject *)0x0;
    }
    else {
      this_02 = (this->doc).wp.value;
    }
    iVar5 = QTextBlock::position(this_00);
    iVar4 = QTextBlock::length(this_00);
    QTextDocument::markContentsDirty((QTextDocument *)this_02,iVar5,iVar4);
  }
  QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSyntaxHighlighterPrivate::applyFormatChanges()
{
    bool formatsChanged = false;

    QTextLayout *layout = currentBlock.layout();

    QList<QTextLayout::FormatRange> ranges = layout->formats();

    const int preeditAreaStart = layout->preeditAreaPosition();
    const int preeditAreaLength = layout->preeditAreaText().size();

    if (preeditAreaLength != 0) {
        auto isOutsidePreeditArea = [=](const QTextLayout::FormatRange &range) {
            return range.start < preeditAreaStart
                    || range.start + range.length > preeditAreaStart + preeditAreaLength;
        };
        if (ranges.removeIf(isOutsidePreeditArea) > 0)
            formatsChanged = true;
    } else if (!ranges.isEmpty()) {
        ranges.clear();
        formatsChanged = true;
    }

    int i = 0;
    while (i < formatChanges.size()) {
        QTextLayout::FormatRange r;

        while (i < formatChanges.size() && formatChanges.at(i) == r.format)
            ++i;

        if (i == formatChanges.size())
            break;

        r.start = i;
        r.format = formatChanges.at(i);

        while (i < formatChanges.size() && formatChanges.at(i) == r.format)
            ++i;

        Q_ASSERT(i <= formatChanges.size());
        r.length = i - r.start;

        if (preeditAreaLength != 0) {
            if (r.start >= preeditAreaStart)
                r.start += preeditAreaLength;
            else if (r.start + r.length >= preeditAreaStart)
                r.length += preeditAreaLength;
        }

        ranges << r;
        formatsChanged = true;
    }

    if (formatsChanged) {
        layout->setFormats(ranges);
        doc->markContentsDirty(currentBlock.position(), currentBlock.length());
    }
}